

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingPriorityQueue.hpp
# Opt level: O0

void __thiscall
gmlc::containers::
BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
::checkPullAndSwap(BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
                   *this)

{
  bool bVar1;
  iterator __first;
  iterator __last;
  unique_lock<std::mutex> *in_RDI;
  unique_lock<std::mutex> pushLock;
  mutex_type *in_stack_ffffffffffffffb8;
  bool *this_00;
  vector<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
  *in_stack_ffffffffffffffd0;
  
  bVar1 = std::
          vector<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
          ::empty(in_stack_ffffffffffffffd0);
  if (bVar1) {
    std::unique_lock<std::mutex>::unique_lock(in_RDI,in_stack_ffffffffffffffb8);
    bVar1 = std::
            vector<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
            ::empty(in_stack_ffffffffffffffd0);
    if (bVar1) {
      CLI::std::atomic<bool>::operator=
                ((atomic<bool> *)in_RDI,SUB81((ulong)in_stack_ffffffffffffffb8 >> 0x38,0));
    }
    else {
      std::
      swap<std::pair<helics::route_id,helics::ActionMessage>,std::allocator<std::pair<helics::route_id,helics::ActionMessage>>>
                ((vector<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
                  *)in_RDI,
                 (vector<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
                  *)in_stack_ffffffffffffffb8);
      std::unique_lock<std::mutex>::unlock(in_RDI);
      this_00 = &in_RDI[6]._M_owns;
      __first = std::
                vector<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
                ::begin((vector<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
                         *)this_00);
      __last = std::
               vector<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
               ::end((vector<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
                      *)this_00);
      std::
      reverse<__gnu_cxx::__normal_iterator<std::pair<helics::route_id,helics::ActionMessage>*,std::vector<std::pair<helics::route_id,helics::ActionMessage>,std::allocator<std::pair<helics::route_id,helics::ActionMessage>>>>>
                ((__normal_iterator<std::pair<helics::route_id,_helics::ActionMessage>_*,_std::vector<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>_>
                  )__first._M_current,
                 (__normal_iterator<std::pair<helics::route_id,_helics::ActionMessage>_*,_std::vector<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>_>
                  )__last._M_current);
    }
    std::unique_lock<std::mutex>::~unique_lock(in_RDI);
  }
  return;
}

Assistant:

void checkPullAndSwap()
        {
            if (pullElements.empty()) {
                std::unique_lock<MUTEX> pushLock(
                    m_pushLock);  // second pushLock
                if (!pushElements.empty()) {  // this is the potential for slow
                                              // operations
                    std::swap(pushElements, pullElements);
                    // we can free the push function to accept more elements
                    // after the swap call;
                    pushLock.unlock();
                    std::reverse(pullElements.begin(), pullElements.end());
                } else {
                    queueEmptyFlag = true;
                }
            }
        }